

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_set_error.c
# Opt level: O0

void test_archive_set_error(void)

{
  archive *a_00;
  archive *a;
  
  a_00 = archive_read_new();
  test(a_00,0xc,"abcdefgh");
  test(a_00,0,"123456");
  test(a_00,-1,"tuvw");
  test(a_00,0x22,"XYZ");
  archive_read_free(a_00);
  return;
}

Assistant:

DEFINE_TEST(test_archive_set_error)
{
	struct archive* a = archive_read_new();

	/* unlike printf("%s", NULL),
	 * archive_set_error(a, code, "%s", NULL)
	 * segfaults, so it's not tested here */
	test(a, 12, "abcdefgh");
	test(a, 0, "123456");
	test(a, -1, "tuvw");
	test(a, 34, "XYZ");

	archive_read_free(a);
}